

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void map_print_key(EditLine *el,el_action_t *map,wchar_t *in)

{
  el_bindings_t *ep;
  el_bindings_t *bp;
  char outbuf [1024];
  wchar_t *in_local;
  el_action_t *map_local;
  EditLine *el_local;
  
  if ((*in == L'\0') || (in[1] == L'\0')) {
    keymacro__decode_str(in,(char *)&bp,0x400,"");
    for (ep = (el->el_map).help; ep < (el->el_map).help + (el->el_map).nfunc; ep = ep + 1) {
      if (ep->func == (uint)map[(uint)(*in & 0xff)]) {
        fprintf((FILE *)el->el_outfile,"%s\t->\t%ls\n",&bp,ep->name);
        return;
      }
    }
  }
  else {
    keymacro_print(el,in);
  }
  return;
}

Assistant:

static void
map_print_key(EditLine *el, el_action_t *map, const wchar_t *in)
{
	char outbuf[EL_BUFSIZ];
	el_bindings_t *bp, *ep;

	if (in[0] == '\0' || in[1] == '\0') {
		(void) keymacro__decode_str(in, outbuf, sizeof(outbuf), "");
		ep = &el->el_map.help[el->el_map.nfunc];
		for (bp = el->el_map.help; bp < ep; bp++)
			if (bp->func == map[(unsigned char) *in]) {
				(void) fprintf(el->el_outfile,
				    "%s\t->\t%ls\n", outbuf, bp->name);
				return;
			}
	} else
		keymacro_print(el, in);
}